

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfImage.cpp
# Opt level: O2

void __thiscall Imf_3_2::Image::clearLevels(Image *this)

{
  long lVar1;
  long *plVar2;
  int y;
  long lVar3;
  int x;
  long lVar4;
  long lVar5;
  
  (this->_dataWindow).min.x = 0;
  (this->_dataWindow).min.y = 0;
  (this->_dataWindow).max.x = -1;
  (this->_dataWindow).max.y = -1;
  lVar5 = 0;
  for (lVar3 = 0; lVar3 < (this->_levels)._sizeX; lVar3 = lVar3 + 1) {
    for (lVar4 = 0; lVar1 = (this->_levels)._sizeY, lVar4 < lVar1; lVar4 = lVar4 + 1) {
      plVar2 = *(long **)((long)(this->_levels)._data + lVar4 * 8 + lVar1 * lVar5);
      if (plVar2 != (long *)0x0) {
        (**(code **)(*plVar2 + 8))();
      }
    }
    lVar5 = lVar5 + 8;
  }
  Array2D<Imf_3_2::ImageLevel_*>::resizeErase(&this->_levels,0,0);
  return;
}

Assistant:

void
Image::clearLevels ()
{
    _dataWindow = Box2i (V2i (0, 0), V2i (-1, -1));

    for (int y = 0; y < _levels.height (); ++y)
        for (int x = 0; x < _levels.width (); ++x)
            delete _levels[y][x];

    _levels.resizeErase (0, 0);
}